

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

date_time * __thiscall booster::locale::date_time::operator=(date_time *this,date_time *other)

{
  hold_ptr<booster::locale::abstract_calendar> hVar1;
  hold_ptr<booster::locale::abstract_calendar> in_RAX;
  date_time tmp;
  date_time local_18;
  
  if (this != other) {
    local_18.impl_.ptr_ =
         (hold_ptr<booster::locale::abstract_calendar>)
         (hold_ptr<booster::locale::abstract_calendar>)in_RAX.ptr_;
    date_time(&local_18,other);
    hVar1.ptr_ = (this->impl_).ptr_;
    (this->impl_).ptr_ = (abstract_calendar *)local_18;
    local_18.impl_.ptr_ =
         (hold_ptr<booster::locale::abstract_calendar>)
         (hold_ptr<booster::locale::abstract_calendar>)hVar1.ptr_;
    ~date_time(&local_18);
  }
  return this;
}

Assistant:

date_time const &date_time::operator = (date_time const &other)
{
    if(this != &other) {
        date_time tmp(other);
        swap(tmp);
    }
    return *this;
}